

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_restore(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  _canvasenvironment *p_Var2;
  t_symbol *ptVar3;
  char *fmt;
  
  if ((3 < argc) && (argv[3].a_type == A_SYMBOL)) {
    p_Var1 = (_glist *)pd_findbyclass(&s__X,canvas_class);
    p_Var2 = canvas_getenv(p_Var1);
    ptVar3 = binbuf_realizedollsym(argv[3].a_w.w_symbol,p_Var2->ce_argc,p_Var2->ce_argv,1);
    canvas_rename(x,ptVar3,(t_symbol *)0x0);
  }
  canvas_pop(x,(float)(*(ushort *)&x->field_0xe8 >> 4 & 1));
  ptVar3 = gensym("#X");
  p_Var1 = (_glist *)ptVar3->s_thing;
  if (p_Var1 == (_glist *)0x0) {
    fmt = "canvas_restore: out of context";
  }
  else {
    if ((p_Var1->gl_obj).te_g.g_pd == canvas_class) {
      x->gl_owner = p_Var1;
      canvas_objfor(p_Var1,&x->gl_obj,argc,argv);
      return;
    }
    fmt = "canvas_restore: wasn\'t a canvas";
  }
  pd_error((void *)0x0,fmt);
  return;
}

Assistant:

void canvas_restore(t_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    t_pd *z;
    if (argc > 3)
    {
        t_atom *ap=argv+3;
        if (ap->a_type == A_SYMBOL)
        {
            t_canvasenvironment *e = canvas_getenv(canvas_getcurrent());
            canvas_rename(x, binbuf_realizedollsym(ap->a_w.w_symbol,
                e->ce_argc, e->ce_argv, 1), 0);
        }
    }
    canvas_pop(x, x->gl_willvis);

    if (!(z = gensym("#X")->s_thing)) pd_error(0, "canvas_restore: out of context");
    else if (*z != canvas_class) pd_error(0, "canvas_restore: wasn't a canvas");
    else
    {
        t_canvas *x2 = (t_canvas *)z;
        x->gl_owner = x2;
        canvas_objfor(x2, &x->gl_obj, argc, argv);
    }
}